

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_subdivs(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  Node *pNVar1;
  long *plVar2;
  value_type *pvVar3;
  long lVar4;
  SubdivMeshNode *pSVar5;
  SubdivMeshNode *pSVar6;
  long *plVar7;
  size_t i;
  ulong uVar8;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  value_type *__x_00;
  long lVar9;
  size_t i_1;
  uint local_60;
  undefined4 uStack_5c;
  SubdivMeshNode *local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar7 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar7 == (long *)0x0) {
      plVar7 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar7 == (long *)0x0) {
          plVar7 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x10))(plVar7);
            local_58 = (SubdivMeshNode *)::operator_new(0x1b0);
            local_50.ptr = (MaterialNode *)plVar7[0x1a];
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            pSVar5 = local_58;
            SubdivMeshNode::SubdivMeshNode(local_58,&local_50,*(BBox1f *)(plVar7 + 0xd),0);
            (*(pSVar5->super_Node).super_RefCount._vptr_RefCount[2])(pSVar5);
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pSVar5 = local_58;
            pvVar3 = (value_type *)plVar7[0xf];
            this_00 = &local_58->positions;
            for (__x_00 = (value_type *)plVar7[0xe]; __x_00 != pvVar3; __x_00 = __x_00 + 1) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::push_back(this_00,__x_00);
            }
            __x = &pSVar5->position_indices;
            lVar9 = 0xc;
            for (uVar8 = 0; pSVar5 = local_58, uVar8 < (ulong)(plVar7[0x18] - plVar7[0x17] >> 4);
                uVar8 = uVar8 + 1) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (__x,(value_type_conflict2 *)(plVar7[0x17] + lVar9 + -0xc));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (__x,(value_type_conflict2 *)(plVar7[0x17] + lVar9 + -8));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (__x,(value_type_conflict2 *)(plVar7[0x17] + lVar9 + -4));
              lVar4 = plVar7[0x17];
              if (*(int *)(lVar4 + -4 + lVar9) != *(int *)(lVar4 + lVar9)) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (__x,(value_type_conflict2 *)(lVar4 + lVar9));
              }
              lVar9 = lVar9 + 0x10;
            }
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::operator=(&local_58->normals,
                        (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(plVar7 + 0x11));
            if ((pSVar5->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (pSVar5->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&pSVar5->normal_indices,__x);
            }
            std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
                      (&pSVar5->texcoords,
                       (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                       (plVar7 + 0x14));
            if ((pSVar5->texcoords).
                super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pSVar5->texcoords).
                super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&pSVar5->texcoord_indices,__x);
            }
            lVar9 = 0xc;
            for (uVar8 = 0; pSVar6 = local_58, lVar4 = plVar7[0x17],
                uVar8 < (ulong)(plVar7[0x18] - lVar4 >> 4); uVar8 = uVar8 + 1) {
              local_60 = (*(int *)(lVar4 + -4 + lVar9) != *(int *)(lVar4 + lVar9)) + 3;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&pSVar5->verticesPerFace,&local_60);
              lVar9 = lVar9 + 0x10;
            }
            *(SubdivMeshNode **)this = local_58;
            (*(local_58->super_Node).super_RefCount._vptr_RefCount[2])(local_58);
            (*(pSVar6->super_Node).super_RefCount._vptr_RefCount[3])(pSVar6);
            (**(code **)(*plVar7 + 0x18))(plVar7);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
        }
        else {
          local_58 = (SubdivMeshNode *)this;
          (**(code **)(*plVar7 + 0x10))(plVar7);
          for (uVar8 = 0; uVar8 < (ulong)(plVar7[0xe] - plVar7[0xd] >> 3); uVar8 = uVar8 + 1) {
            local_48.ptr = *(Node **)(plVar7[0xd] + uVar8 * 8);
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_quads_to_subdivs((SceneGraph *)&local_60,&local_48);
            lVar9 = plVar7[0xd];
            plVar2 = *(long **)(lVar9 + uVar8 * 8);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 0x18))();
            }
            *(ulong *)(lVar9 + uVar8 * 8) = CONCAT44(uStack_5c,local_60);
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
          this = (SceneGraph *)local_58;
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        local_40.ptr = (Node *)plVar7[0x10];
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_quads_to_subdivs((SceneGraph *)&local_60,&local_40);
        if ((long *)plVar7[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar7[0x10] + 0x18))();
        }
        plVar7[0x10] = CONCAT44(uStack_5c,local_60);
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar7 + 0x10))(plVar7);
      local_38.ptr = (Node *)plVar7[0x13];
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_quads_to_subdivs((SceneGraph *)&local_60,&local_38);
      if ((long *)plVar7[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar7[0x13] + 0x18))();
      }
      plVar7[0x13] = CONCAT44(uStack_5c,local_60);
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_subdivs(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_subdivs(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> tmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::SubdivMeshNode> smesh = new SceneGraph::SubdivMeshNode(tmesh->material,tmesh->time_range,0);

      for (auto& p : tmesh->positions)
        smesh->positions.push_back(p);

      for (size_t i=0; i<tmesh->quads.size(); i++) {
        smesh->position_indices.push_back(tmesh->quads[i].v0);
        smesh->position_indices.push_back(tmesh->quads[i].v1);
        smesh->position_indices.push_back(tmesh->quads[i].v2);
        if (tmesh->quads[i].v2 != tmesh->quads[i].v3)
          smesh->position_indices.push_back(tmesh->quads[i].v3);
      }
      
      smesh->normals = tmesh->normals;
      if (smesh->normals.size())
        smesh->normal_indices = smesh->position_indices;
      
      smesh->texcoords = tmesh->texcoords;
      if (smesh->texcoords.size())
        smesh->texcoord_indices = smesh->position_indices;
      
      for (size_t i=0; i<tmesh->quads.size(); i++) 
        smesh->verticesPerFace.push_back(3 + (int)(tmesh->quads[i].v2 != tmesh->quads[i].v3));

      return smesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }